

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<char_const*const&,char_const(&)[2],unsigned_int_const&,char_const(&)[2],unsigned_int_const&,char_const(&)[5],char_const*const&>
          (String *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],uint *params_2
          ,char (*params_3) [2],uint *params_4,char (*params_5) [5],char **params_6)

{
  char **ppcVar1;
  char (*pacVar2) [2];
  kj *pkVar3;
  char (*value) [5];
  uint *value_00;
  uint *value_01;
  String *params_6_00;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  CappedArray<char,_14UL> local_98;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_14UL> local_70;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char (*local_38) [2];
  uint *params_local_4;
  char (*params_local_3) [2];
  uint *params_local_2;
  char (*params_local_1) [2];
  char **params_local;
  
  params_6_00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = params_2;
  params_local_3 = params_1;
  params_local_2 = (uint *)params;
  params_local_1 = (char (*) [2])this;
  params_local = (char **)__return_storage_ptr__;
  ppcVar1 = fwd<char_const*const&>((char **)this);
  local_48 = toCharSequence<char_const*const&>(ppcVar1);
  pacVar2 = ::const((char (*) [2])params_local_2);
  local_58 = toCharSequence<char_const(&)[2]>(pacVar2);
  pkVar3 = (kj *)fwd<unsigned_int_const&>((uint *)params_local_3);
  toCharSequence<unsigned_int_const&>(&local_70,pkVar3,value_00);
  pacVar2 = ::const((char (*) [2])params_local_4);
  local_80 = toCharSequence<char_const(&)[2]>(pacVar2);
  pkVar3 = (kj *)fwd<unsigned_int_const&>((uint *)local_38);
  toCharSequence<unsigned_int_const&>(&local_98,pkVar3,value_01);
  value = ::const((char (*) [5])params_4);
  local_a8 = toCharSequence<char_const(&)[5]>(value);
  ppcVar1 = fwd<char_const*const&>((char **)params_5);
  local_b8 = toCharSequence<char_const*const&>(ppcVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_6_00,(_ *)&local_48,&local_58,(ArrayPtr<const_char> *)&local_70,
             (CappedArray<char,_14UL> *)&local_80,(ArrayPtr<const_char> *)&local_98,
             (CappedArray<char,_14UL> *)&local_a8,&local_b8,(ArrayPtr<const_char> *)params_6_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}